

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O1

void build_lisp_map(void)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  
  Stackspace = Lisp_world + 0x10000;
  Plistspace = Lisp_world + 0x30000;
  DTDspace = Lisp_world + 0x141000;
  MDStypetbl = Lisp_world + 0x180000;
  AtomHT = Lisp_world + 0x150000;
  Pnamespace = Lisp_world + 0x80000;
  AtomSpace = Lisp_world + 0x2c0000;
  Defspace = Lisp_world + 0xa0000;
  Valspace = Lisp_world + 0xc0000;
  ListpDTD = (dtd *)(Lisp_world + 0x14105a);
  FPtoVP = (LispPTR *)(Lisp_world + 0x20000);
  IOPage = (IOPAGE *)(Lisp_world + 0xff00);
  InterfacePage = (IFPAGE *)(Lisp_world + 0x140000);
  MiscStats = (MISCSTATS *)(Lisp_world + 0x140a00);
  UFNTable = Lisp_world + 0x140c00;
  DisplayRegion = Lisp_world + 0x120000;
  HTmain = (LispPTR *)(Lisp_world + 0x160000);
  HToverflow = (LispPTR *)(Lisp_world + 0x170000);
  HTbigcount = (LispPTR *)(Lisp_world + 0x170100);
  HTcoll = (LispPTR *)(Lisp_world + 0x1c0000);
  Reclaim_cnt_word = MakeAtom68k("\\RECLAIM.COUNTDOWN");
  GcDisabled_word = MakeAtom68k("\\GCDISABLED");
  FreeBlockBuckets_word = MakeAtom68k("\\FREEBLOCKBUCKETS");
  Array_Block_Checking_word = MakeAtom68k("ARRAYBLOCKCHECKING");
  ArrayMerging_word = MakeAtom68k("\\ARRAYMERGING");
  ArraySpace_word = MakeAtom68k("\\ARRAYSPACE");
  ArraySpace2_word = MakeAtom68k("\\ARRAYSPACE2");
  ArrayFrLst_word = MakeAtom68k("\\ArrayFrLst");
  ArrayFrLst2_word = MakeAtom68k("\\ArrayFrLst2");
  Hunk_word = MakeAtom68k("\\HUNKING?");
  System_Buffer_List_word = MakeAtom68k("SYSTEMBUFFERLIST");
  GcMess_word = MakeAtom68k("GCMESS");
  ReclaimMin_word = MakeAtom68k("\\RECLAIMMIN");
  Package_from_Index_word = MakeAtom68k("*PACKAGE-FROM-INDEX*");
  Package_from_Name_word = MakeAtom68k("*PACKAGE-FROM-NAME*");
  Keyword_Package_word = MakeAtom68k("*KEYWORD-PACKAGE*");
  MVLIST_index = MAKEATOM("\\MVLIST");
  if (for_makeinit == 0) {
    LVar1 = get_package_atom("*CLOSURE-CACHE-ENABLED*",0x17,"SI",2,0);
    Closure_Cache_Enabled_word = (LispPTR *)((long)AtomSpace + (ulong)((LVar1 & 0xffff) * 0x14) + 4)
    ;
    LVar1 = get_package_atom("*CLOSURE-CACHE*",0xf,"SI",2,0);
    Closure_Cache_word = (LispPTR *)((long)AtomSpace + (ulong)((LVar1 & 0xffff) * 0x14) + 4);
    LVar1 = get_package_atom("*DELETED-IMPLICIT-HASH-SLOT*",0x1c,"XCL",3,0);
    Deleted_Implicit_Hash_Slot_word =
         (LispPTR *)((long)AtomSpace + (ulong)((LVar1 & 0xffff) * 0x14) + 4);
  }
  else {
    Closure_Cache_Enabled_word = (LispPTR *)malloc(4);
    *Closure_Cache_Enabled_word = 0;
    Closure_Cache_word = (LispPTR *)malloc(4);
    *Closure_Cache_word = 0;
    Deleted_Implicit_Hash_Slot_word = (LispPTR *)malloc(4);
    *Deleted_Implicit_Hash_Slot_word = 0;
  }
  STORAGEFULLSTATE_index = MAKEATOM("\\STORAGEFULLSTATE");
  STORAGEFULLSTATE_word = MakeAtom68k("\\STORAGEFULLSTATE");
  STORAGEFULL_word = MakeAtom68k("\\STORAGEFULL");
  PENDINGINTERRUPT_word = MakeAtom68k("\\PENDINGINTERRUPT");
  pLVar2 = MakeAtom68k("\\LeastMDSPage");
  LeastMDSPage_word = fixp_value(pLVar2);
  pLVar2 = MakeAtom68k("\\SecondMDSPage");
  SecondMDSPage_word = fixp_value(pLVar2);
  pLVar2 = MakeAtom68k("\\SecondArrayPage");
  SecondArrayPage_word = fixp_value(pLVar2);
  INTERRUPTSTATE_word = MakeAtom68k("\\INTERRUPTSTATE");
  SYSTEMCACHEVARS_word = MakeAtom68k("\\SYSTEMCACHEVARS");
  MACHINETYPE_word = MakeAtom68k("\\MACHINETYPE");
  pLVar2 = MakeAtom68k("\\LASTVMEMFILEPAGE");
  LASTVMEMFILEPAGE_word = fixp_value(pLVar2);
  VMEM_FULL_STATE_word = MakeAtom68k("\\VMEM.FULL.STATE");
  pLVar2 = MakeAtom68k("\\NxtMDSPage");
  Next_MDSpage_word = fixp_value(pLVar2);
  pLVar2 = MakeAtom68k("\\NxtArrayPage");
  Next_Array_word = fixp_value(pLVar2);
  MDS_free_page_word = MakeAtom68k("\\MDSFREELISTPAGE");
  MaxTypeNumber_word = MakeAtom68k("\\MaxTypeNumber");
  STACKOVERFLOW_word = MakeAtom68k("\\STACKOVERFLOW");
  GuardStackAddr_word = MakeAtom68k("\\GuardStackAddr");
  LastStackAddr_word = MakeAtom68k("\\LastStackAddr");
  NeedHardreturnCleanup_word = MakeAtom68k("\\NEED.HARDRESET.CLEANUP");
  LVar1 = MAKEATOM("TEXTURE");
  TEXTURE_atom = (DLword)LVar1;
  LVar1 = MAKEATOM("MERGE");
  MERGE_atom = (DLword)LVar1;
  LVar1 = MAKEATOM("INPUT");
  INPUT_atom = (DLword)LVar1;
  LVar1 = MAKEATOM("INVERT");
  INVERT_atom = (DLword)LVar1;
  LVar1 = MAKEATOM("ERASE");
  ERASE_atom = (DLword)LVar1;
  LVar1 = MAKEATOM("PAINT");
  PAINT_atom = (DLword)LVar1;
  LVar1 = MAKEATOM("REPLACE");
  REPLACE_atom = (DLword)LVar1;
  init_for_keyhandle();
  init_for_bltchar();
  init_for_bitblt();
  return;
}

Assistant:

void build_lisp_map(void) {
  DLword index;

  Stackspace = (DLword *)NativeAligned2FromLAddr(STK_OFFSET);
  Plistspace = (DLword *)NativeAligned2FromLAddr(PLIS_OFFSET);
  DTDspace = (DLword *)NativeAligned2FromLAddr(DTD_OFFSET);
  MDStypetbl = (DLword *)NativeAligned2FromLAddr(MDS_OFFSET);
  AtomHT = (DLword *)NativeAligned2FromLAddr(ATMHT_OFFSET);
  Pnamespace = (DLword *)NativeAligned2FromLAddr(PNP_OFFSET);
  AtomSpace = (DLword *)NativeAligned2FromLAddr(ATOMS_OFFSET);
  Defspace = (DLword *)NativeAligned2FromLAddr(DEFS_OFFSET);
  Valspace = (DLword *)NativeAligned2FromLAddr(VALS_OFFSET);

  DBPRINT(("Stackspace = %p.\n", (void *)Stackspace));
  DBPRINT(("AtomHT = %p.\n", (void *)AtomHT));

  ListpDTD = (struct dtd *)GetDTD(TYPE_LISTP);

#ifdef BIGVM
  FPtoVP = (LispPTR *)NativeAligned4FromLAddr(FPTOVP_OFFSET);
#else
  FPtoVP = (DLword *)NativeAligned2FromLAddr(FPTOVP_OFFSET);
#endif /* BIGVM */
  IOPage = (IOPAGE *)NativeAligned4FromLAddr(IOPAGE_OFFSET);
  InterfacePage = (IFPAGE *)NativeAligned4FromLAddr(IFPAGE_OFFSET);
  MiscStats = (MISCSTATS *)NativeAligned4FromLAddr(MISCSTATS_OFFSET);

  UFNTable = (DLword *)NativeAligned2FromLAddr(UFNTBL_OFFSET);
  DisplayRegion = (DLword *)NativeAligned2FromLAddr(DISPLAY_OFFSET);

  HTmain = (GCENTRY *)NativeAligned4FromLAddr(HTMAIN_OFFSET);
  HToverflow = (GCENTRY *)NativeAligned4FromLAddr(HTOVERFLOW_OFFSET);
  HTbigcount = (GCENTRY *)NativeAligned4FromLAddr(HTBIG_OFFSET);
  HTcoll = (GCENTRY *)NativeAligned4FromLAddr(HTCOLL_OFFSET);

  /**** cache values *****/
  Reclaim_cnt_word = MakeAtom68k("\\RECLAIM.COUNTDOWN");

  /*** cache values for gcreclaimer : added by T. Teruuchi 30-Sep-1987 ***/

  GcDisabled_word = MakeAtom68k("\\GCDISABLED");

  /*** following cache values are the solution for array reclaimer ***/

  FreeBlockBuckets_word = MakeAtom68k("\\FREEBLOCKBUCKETS");
  Array_Block_Checking_word = MakeAtom68k("ARRAYBLOCKCHECKING");
  ArrayMerging_word = MakeAtom68k("\\ARRAYMERGING");
  ArraySpace_word = MakeAtom68k("\\ARRAYSPACE");
  ArraySpace2_word = MakeAtom68k("\\ARRAYSPACE2");
  ArrayFrLst_word = MakeAtom68k("\\ArrayFrLst");
  ArrayFrLst2_word = MakeAtom68k("\\ArrayFrLst2");
  Hunk_word = MakeAtom68k("\\HUNKING?");
  System_Buffer_List_word = MakeAtom68k("SYSTEMBUFFERLIST");

  /*** The following cache values are for the top level reclaimer ***/

  GcMess_word = MakeAtom68k("GCMESS");
  ReclaimMin_word = MakeAtom68k("\\RECLAIMMIN");

  /*** The following caches are for Symbol lookup April-28,1988 Tomtom ***/

  Package_from_Index_word = MakeAtom68k("*PACKAGE-FROM-INDEX*");
  Package_from_Name_word = MakeAtom68k("*PACKAGE-FROM-NAME*");
  Keyword_Package_word = MakeAtom68k("*KEYWORD-PACKAGE*");
  DBPRINT(("Package_from_Index_word = %p\n", (void *)Package_from_Index_word));
  DBPRINT(("Package_from_Name_word  = %p\n", (void *)Package_from_Name_word));

  /*** The following atom-index cache is for CL:VALUES opcode JDS 4/5/89 ***/

  MVLIST_index = MAKEATOM("\\MVLIST");

  /* * * Atoms for closure-cache interface * * */

  if (for_makeinit) {
    Closure_Cache_Enabled_word = (LispPTR *)malloc(4);
    *Closure_Cache_Enabled_word = NIL;

    Closure_Cache_word = (LispPTR *)malloc(4);
    *Closure_Cache_word = NIL;

    Deleted_Implicit_Hash_Slot_word = (LispPTR *)malloc(4);
    *Deleted_Implicit_Hash_Slot_word = NIL;
  } else {
    DBPRINT(("%p %p %p %p %p", (void *)Stackspace, (void *)Plistspace, (void *)DTDspace, (void *)MDStypetbl, (void *)AtomHT));

    index = get_package_atom("*CLOSURE-CACHE-ENABLED*", 23, "SI", 2, NIL);
    Closure_Cache_Enabled_word = GetVALCELL68k(index);

    index = get_package_atom("*CLOSURE-CACHE*", 15, "SI", 2, NIL);
    Closure_Cache_word = GetVALCELL68k(index);

    index = get_package_atom("*DELETED-IMPLICIT-HASH-SLOT*", 28, "XCL", 3, NIL);
    Deleted_Implicit_Hash_Slot_word = GetVALCELL68k(index);
  }

  /*** THE following CACHE values are added by Take. ***/
  /* The fixp_value calls make sure that those values are held
     in FIXP cells (and the ..._word variable points to that cell)
     so that the BIGVM code can go beyond 16 bits of page # */

  STORAGEFULLSTATE_index = MAKEATOM("\\STORAGEFULLSTATE");
  STORAGEFULLSTATE_word = MakeAtom68k("\\STORAGEFULLSTATE");
  STORAGEFULL_word = MakeAtom68k("\\STORAGEFULL");
  PENDINGINTERRUPT_word = MakeAtom68k("\\PENDINGINTERRUPT");
  LeastMDSPage_word = fixp_value(MakeAtom68k("\\LeastMDSPage"));
  SecondMDSPage_word = fixp_value(MakeAtom68k("\\SecondMDSPage"));
  SecondArrayPage_word = fixp_value(MakeAtom68k("\\SecondArrayPage"));
  INTERRUPTSTATE_word = MakeAtom68k("\\INTERRUPTSTATE");
  SYSTEMCACHEVARS_word = MakeAtom68k("\\SYSTEMCACHEVARS");
  MACHINETYPE_word = MakeAtom68k("\\MACHINETYPE");
  LASTVMEMFILEPAGE_word = fixp_value(MakeAtom68k("\\LASTVMEMFILEPAGE"));
  VMEM_FULL_STATE_word = MakeAtom68k("\\VMEM.FULL.STATE");
  Next_MDSpage_word = fixp_value(MakeAtom68k("\\NxtMDSPage"));
  Next_Array_word = fixp_value(MakeAtom68k("\\NxtArrayPage"));
  MDS_free_page_word = MakeAtom68k("\\MDSFREELISTPAGE");
  MaxTypeNumber_word = MakeAtom68k("\\MaxTypeNumber");

  /*** The following are STK-OVER-FLOW stuff * Take **/
  STACKOVERFLOW_word = MakeAtom68k("\\STACKOVERFLOW");
  GuardStackAddr_word = MakeAtom68k("\\GuardStackAddr");
  LastStackAddr_word = MakeAtom68k("\\LastStackAddr");
  NeedHardreturnCleanup_word = MakeAtom68k("\\NEED.HARDRESET.CLEANUP");

  /*** The addition of cache values for Bitblt by osamu April 13, 1988 ***/
  TEXTURE_atom = MAKEATOM("TEXTURE");
  MERGE_atom = MAKEATOM("MERGE");
  INPUT_atom = MAKEATOM("INPUT");
  INVERT_atom = MAKEATOM("INVERT");
  ERASE_atom = MAKEATOM("ERASE");
  PAINT_atom = MAKEATOM("PAINT");
  REPLACE_atom = MAKEATOM("REPLACE");

  /*** Do initialization for specific devices ***/
  init_for_keyhandle(); /* keyboard-interrupt handler */
  init_for_bltchar();   /* BLTCHAR speed-up */
  init_for_bitblt();    /* BITBLT-to-display speed-up */
}